

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<wchar_t_*>
fmt::v8::detail::format_decimal<wchar_t,unsigned_int>(wchar_t *out,uint value,int size)

{
  undefined2 uVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  uint uVar4;
  wchar_t *pwVar5;
  undefined1 uVar7;
  undefined1 auVar6 [16];
  format_decimal_result<wchar_t_*> fVar8;
  
  uVar4 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  if ((int)((ulong)value + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar4 * 8) >>
           0x20) <= size) {
    pwVar2 = out + size;
    uVar3 = (ulong)value;
    while( true ) {
      pwVar5 = pwVar2 + -2;
      uVar4 = (uint)uVar3;
      if (uVar4 < 100) break;
      uVar1 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + (uVar3 % 100) * 2);
      uVar7 = (undefined1)((ushort)uVar1 >> 8);
      auVar6 = ZEXT416(CONCAT22((short)(CONCAT13(uVar7,CONCAT12(uVar7,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar6 = pshuflw(auVar6,auVar6,0x60);
      *(ulong *)pwVar5 = CONCAT44(auVar6._4_4_ >> 0x18,auVar6._0_4_ >> 0x18);
      pwVar2 = pwVar5;
      uVar3 = uVar3 / 100;
    }
    if (uVar4 < 10) {
      pwVar2[-1] = uVar4 | 0x30;
      pwVar5 = pwVar2 + -1;
    }
    else {
      uVar1 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + uVar3 * 2);
      uVar7 = (undefined1)((ushort)uVar1 >> 8);
      auVar6 = ZEXT416(CONCAT22((short)(CONCAT13(uVar7,CONCAT12(uVar7,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar6 = pshuflw(auVar6,auVar6,0x60);
      *(ulong *)pwVar5 = CONCAT44(auVar6._4_4_ >> 0x18,auVar6._0_4_ >> 0x18);
    }
    fVar8.end = out + size;
    fVar8.begin = pwVar5;
    return fVar8;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}